

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.c
# Opt level: O1

void av1_reset_loop_restoration(MACROBLOCKD *xd,int num_planes)

{
  int *piVar1;
  long lVar2;
  
  if (0 < num_planes) {
    piVar1 = xd->sgrproj_info[0].xqd + 1;
    lVar2 = 0;
    do {
      *(undefined8 *)((long)xd->wiener_info[0].hfilter + lVar2) = 0xffea000ffff90003;
      *(undefined8 *)((long)xd->wiener_info[0].vfilter + lVar2) = 0xffea000ffff90003;
      *(undefined2 *)((long)xd->wiener_info[0].hfilter + lVar2 + 8) = 0xf;
      *(undefined2 *)((long)xd->wiener_info[0].vfilter + lVar2 + 8) = 0xf;
      *(undefined4 *)((long)xd->wiener_info[0].hfilter + lVar2 + 10) = 0x3fff9;
      *(undefined4 *)((long)xd->wiener_info[0].vfilter + lVar2 + 10) = 0x3fff9;
      piVar1[-1] = -0x20;
      piVar1[0] = 0x1f;
      piVar1 = piVar1 + 3;
      lVar2 = lVar2 + 0x20;
    } while ((ulong)(uint)num_planes << 5 != lVar2);
  }
  return;
}

Assistant:

void av1_reset_loop_restoration(MACROBLOCKD *xd, const int num_planes) {
  for (int p = 0; p < num_planes; ++p) {
    set_default_wiener(xd->wiener_info + p);
    set_default_sgrproj(xd->sgrproj_info + p);
  }
}